

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  yColCache *p;
  int i;
  int nReg_local;
  int iReg_local;
  Parse *pParse_local;
  
  p._4_4_ = 0;
  while (p._4_4_ < (int)(uint)pParse->nColCache) {
    if ((pParse->aColCache[p._4_4_].iReg < iReg) || (iReg + nReg <= pParse->aColCache[p._4_4_].iReg)
       ) {
      p._4_4_ = p._4_4_ + 1;
    }
    else {
      cacheEntryClear(pParse,p._4_4_);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i = 0;
  while( i<pParse->nColCache ){
    struct yColCache *p = &pParse->aColCache[i];
    if( p->iReg >= iReg && p->iReg < iReg+nReg ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}